

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::String>_>_>
__thiscall
kj::
heap<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::String>>,kj::Own<kj::_::PromiseNode>,kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::String>>
          (kj *this,Own<kj::_::PromiseNode> *params,
          Tuple<kj::Own<kj::AsyncOutputStream>,_kj::String> *params_1)

{
  AsyncOutputStream *pAVar1;
  AttachmentPromiseNodeBase *this_00;
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::String>_> *extraout_RDX;
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::String>_>_>
  OVar2;
  
  this_00 = (AttachmentPromiseNodeBase *)operator_new(0x40);
  _::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,params);
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00441448;
  pAVar1 = (params_1->impl).super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.ptr;
  this_00[1].super_PromiseNode._vptr_PromiseNode =
       (_func_int **)
       (params_1->impl).super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.disposer;
  this_00[1].dependency.disposer = (Disposer *)pAVar1;
  (params_1->impl).super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.ptr =
       (AsyncOutputStream *)0x0;
  this_00[1].dependency.ptr =
       (PromiseNode *)(params_1->impl).super_TupleElement<1U,_kj::String>.value.content.ptr;
  this_00[2].super_PromiseNode._vptr_PromiseNode =
       (_func_int **)(params_1->impl).super_TupleElement<1U,_kj::String>.value.content.size_;
  this_00[2].dependency.disposer =
       (Disposer *)(params_1->impl).super_TupleElement<1U,_kj::String>.value.content.disposer;
  (params_1->impl).super_TupleElement<1U,_kj::String>.value.content.ptr = (char *)0x0;
  (params_1->impl).super_TupleElement<1U,_kj::String>.value.content.size_ = 0;
  *(undefined8 **)this =
       &_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::String>>>
        ::instance;
  *(AttachmentPromiseNodeBase **)(this + 8) = this_00;
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}